

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint readChunk_tRNS(LodePNGColorMode *color,uchar *data,size_t chunkLength)

{
  uint uVar1;
  uint i;
  size_t chunkLength_local;
  uchar *data_local;
  LodePNGColorMode *color_local;
  
  if (color->colortype == LCT_PALETTE) {
    if (color->palettesize < chunkLength) {
      return 0x26;
    }
    for (i = 0; i != chunkLength; i = i + 1) {
      color->palette[i * 4 + 3] = data[i];
    }
  }
  else if (color->colortype == LCT_GREY) {
    if (chunkLength != 2) {
      return 0x1e;
    }
    color->key_defined = 1;
    uVar1 = (uint)*data * 0x100 + (uint)data[1];
    color->key_b = uVar1;
    color->key_g = uVar1;
    color->key_r = uVar1;
  }
  else {
    if (color->colortype != LCT_RGB) {
      return 0x2a;
    }
    if (chunkLength != 6) {
      return 0x29;
    }
    color->key_defined = 1;
    color->key_r = (uint)*data * 0x100 + (uint)data[1];
    color->key_g = (uint)data[2] * 0x100 + (uint)data[3];
    color->key_b = (uint)data[4] * 0x100 + (uint)data[5];
  }
  return 0;
}

Assistant:

static unsigned readChunk_tRNS(LodePNGColorMode* color, const unsigned char* data, size_t chunkLength)
{
	unsigned i;
	if (color->colortype == LCT_PALETTE)
	{
		/*error: more alpha values given than there are palette entries*/
		if (chunkLength > color->palettesize) return 38;

		for (i = 0; i != chunkLength; ++i) color->palette[4 * i + 3] = data[i];
	}
	else if (color->colortype == LCT_GREY)
	{
		/*error: this chunk must be 2 bytes for greyscale image*/
		if (chunkLength != 2) return 30;

		color->key_defined = 1;
		color->key_r = color->key_g = color->key_b = 256u * data[0] + data[1];
	}
	else if (color->colortype == LCT_RGB)
	{
		/*error: this chunk must be 6 bytes for RGB image*/
		if (chunkLength != 6) return 41;

		color->key_defined = 1;
		color->key_r = 256u * data[0] + data[1];
		color->key_g = 256u * data[2] + data[3];
		color->key_b = 256u * data[4] + data[5];
	}
	else return 42; /*error: tRNS chunk not allowed for other color models*/

	return 0; /* OK */
}